

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strlen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint in_EAX;
  anon_union_8_3_18420de5_for_x aVar1;
  int iLen;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (0 < nArg) {
    jx9_value_to_string(*apArg,(int *)((long)&uStack_18 + 4));
  }
  aVar1 = (anon_union_8_3_18420de5_for_x)(long)uStack_18._4_4_;
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar1;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strlen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen = 0;
	if( nArg > 0 ){
		jx9_value_to_string(apArg[0], &iLen);
	}
	/* String length */
	jx9_result_int(pCtx, iLen);
	return JX9_OK;
}